

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O0

void al_convert_mask_to_alpha(ALLEGRO_BITMAP *bitmap,ALLEGRO_COLOR mask_color)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  _Bool _Var7;
  ALLEGRO_LOCKED_REGION *pAVar8;
  long in_RDI;
  char in_XMM0_Ba;
  char in_XMM0_Bb;
  char in_XMM0_Bc;
  char cVar9;
  char in_XMM0_Bd;
  char cVar10;
  char in_XMM0_Be;
  char cVar11;
  char in_XMM0_Bf;
  char cVar12;
  char in_XMM0_Bg;
  char cVar13;
  char in_XMM0_Bh;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  undefined8 in_XMM1_Qa;
  ALLEGRO_COLOR color;
  ALLEGRO_STATE state;
  ALLEGRO_COLOR alpha_pixel;
  ALLEGRO_COLOR pixel;
  int y;
  int x;
  ALLEGRO_LOCKED_REGION *lr;
  int in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  ALLEGRO_BITMAP *in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffbcc;
  ALLEGRO_BITMAP *in_stack_fffffffffffffbd0;
  char *in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbe4;
  char *in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbf4;
  char *in_stack_fffffffffffffbf8;
  int in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  ALLEGRO_BITMAP *in_stack_fffffffffffffc50;
  char local_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  char cStack_30;
  char cStack_2f;
  char cStack_2e;
  char cStack_2d;
  char cStack_2c;
  char cStack_2b;
  char cStack_2a;
  char cStack_29;
  int local_28;
  int local_24;
  char cStack_8;
  char cStack_7;
  char cStack_6;
  char cStack_5;
  char cStack_4;
  char cStack_3;
  char cStack_2;
  char cStack_1;
  
  pAVar8 = al_lock_bitmap(in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
                          in_stack_fffffffffffffb98);
  if (pAVar8 == (ALLEGRO_LOCKED_REGION *)0x0) {
    _Var7 = _al_trace_prefix(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4,
                             in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                             in_stack_fffffffffffffbd8);
    if (_Var7) {
      _al_trace_suffix("Couldn\'t lock bitmap.");
    }
  }
  else {
    al_store_state((ALLEGRO_STATE *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc);
    al_set_target_bitmap(in_stack_fffffffffffffbd0);
    al_map_rgba('\0','\0','\0','\0');
    for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x28); local_28 = local_28 + 1) {
      for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x24); local_24 = local_24 + 1) {
        color = al_get_pixel(in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                             in_stack_fffffffffffffc48);
        cStack_8 = (char)in_XMM1_Qa;
        cStack_7 = (char)((ulong)in_XMM1_Qa >> 8);
        cStack_6 = (char)((ulong)in_XMM1_Qa >> 0x10);
        cStack_5 = (char)((ulong)in_XMM1_Qa >> 0x18);
        cStack_4 = (char)((ulong)in_XMM1_Qa >> 0x20);
        cStack_3 = (char)((ulong)in_XMM1_Qa >> 0x28);
        cStack_2 = (char)((ulong)in_XMM1_Qa >> 0x30);
        cStack_1 = (char)((ulong)in_XMM1_Qa >> 0x38);
        local_38 = color.r._0_1_;
        cStack_37 = color.r._1_1_;
        cStack_36 = color.r._2_1_;
        cStack_35 = color.r._3_1_;
        cStack_34 = color.g._0_1_;
        cStack_33 = color.g._1_1_;
        cStack_32 = color.g._2_1_;
        cStack_31 = color.g._3_1_;
        cStack_30 = color.b._0_1_;
        cStack_2f = color.b._1_1_;
        cStack_2e = color.b._2_1_;
        cStack_2d = color.b._3_1_;
        cStack_2c = color.a._0_1_;
        cStack_2b = color.a._1_1_;
        cStack_2a = color.a._2_1_;
        cStack_29 = color.a._3_1_;
        cVar9 = -(cStack_36 == in_XMM0_Bc);
        cVar10 = -(cStack_35 == in_XMM0_Bd);
        cVar11 = -(cStack_34 == in_XMM0_Be);
        cVar12 = -(cStack_33 == in_XMM0_Bf);
        cVar13 = -(cStack_32 == in_XMM0_Bg);
        cVar14 = -(cStack_31 == in_XMM0_Bh);
        cVar15 = -(cStack_30 == cStack_8);
        cVar16 = -(cStack_2f == cStack_7);
        cVar17 = -(cStack_2e == cStack_6);
        cVar18 = -(cStack_2d == cStack_5);
        cVar19 = -(cStack_2c == cStack_4);
        cVar20 = -(cStack_2b == cStack_3);
        cVar21 = -(cStack_2a == cStack_2);
        bVar22 = -(cStack_29 == cStack_1);
        auVar1[1] = -(cStack_37 == in_XMM0_Bb);
        auVar1[0] = -(local_38 == in_XMM0_Ba);
        auVar1[2] = cVar9;
        auVar1[3] = cVar10;
        auVar1[4] = cVar11;
        auVar1[5] = cVar12;
        auVar1[6] = cVar13;
        auVar1[7] = cVar14;
        auVar1[8] = cVar15;
        auVar1[9] = cVar16;
        auVar1[10] = cVar17;
        auVar1[0xb] = cVar18;
        auVar1[0xc] = cVar19;
        auVar1[0xd] = cVar20;
        auVar1[0xe] = cVar21;
        auVar1[0xf] = bVar22;
        auVar2[1] = -(cStack_37 == in_XMM0_Bb);
        auVar2[0] = -(local_38 == in_XMM0_Ba);
        auVar2[2] = cVar9;
        auVar2[3] = cVar10;
        auVar2[4] = cVar11;
        auVar2[5] = cVar12;
        auVar2[6] = cVar13;
        auVar2[7] = cVar14;
        auVar2[8] = cVar15;
        auVar2[9] = cVar16;
        auVar2[10] = cVar17;
        auVar2[0xb] = cVar18;
        auVar2[0xc] = cVar19;
        auVar2[0xd] = cVar20;
        auVar2[0xe] = cVar21;
        auVar2[0xf] = bVar22;
        auVar6[1] = cVar10;
        auVar6[0] = cVar9;
        auVar6[2] = cVar11;
        auVar6[3] = cVar12;
        auVar6[4] = cVar13;
        auVar6[5] = cVar14;
        auVar6[6] = cVar15;
        auVar6[7] = cVar16;
        auVar6[8] = cVar17;
        auVar6[9] = cVar18;
        auVar6[10] = cVar19;
        auVar6[0xb] = cVar20;
        auVar6[0xc] = cVar21;
        auVar6[0xd] = bVar22;
        auVar5[1] = cVar11;
        auVar5[0] = cVar10;
        auVar5[2] = cVar12;
        auVar5[3] = cVar13;
        auVar5[4] = cVar14;
        auVar5[5] = cVar15;
        auVar5[6] = cVar16;
        auVar5[7] = cVar17;
        auVar5[8] = cVar18;
        auVar5[9] = cVar19;
        auVar5[10] = cVar20;
        auVar5[0xb] = cVar21;
        auVar5[0xc] = bVar22;
        auVar4[1] = cVar12;
        auVar4[0] = cVar11;
        auVar4[2] = cVar13;
        auVar4[3] = cVar14;
        auVar4[4] = cVar15;
        auVar4[5] = cVar16;
        auVar4[6] = cVar17;
        auVar4[7] = cVar18;
        auVar4[8] = cVar19;
        auVar4[9] = cVar20;
        auVar4[10] = cVar21;
        auVar4[0xb] = bVar22;
        auVar3[1] = cVar13;
        auVar3[0] = cVar12;
        auVar3[2] = cVar14;
        auVar3[3] = cVar15;
        auVar3[4] = cVar16;
        auVar3[5] = cVar17;
        auVar3[6] = cVar18;
        auVar3[7] = cVar19;
        auVar3[8] = cVar20;
        auVar3[9] = cVar21;
        auVar3[10] = bVar22;
        if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                     (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                     (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                     (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                     (ushort)((byte)(CONCAT19(bVar22,CONCAT18(cVar21,CONCAT17(cVar20,CONCAT16(cVar19
                                                  ,CONCAT15(cVar18,CONCAT14(cVar17,CONCAT13(cVar16,
                                                  CONCAT12(cVar15,CONCAT11(cVar14,cVar13))))))))) >>
                                    7) & 1) << 6 |
                     (ushort)((byte)(CONCAT18(bVar22,CONCAT17(cVar21,CONCAT16(cVar20,CONCAT15(cVar19
                                                  ,CONCAT14(cVar18,CONCAT13(cVar17,CONCAT12(cVar16,
                                                  CONCAT11(cVar15,cVar14)))))))) >> 7) & 1) << 7 |
                    (ushort)(bVar22 >> 7) << 0xf) == 0xffff) {
          al_put_pixel(0,0x142e1e,color);
        }
      }
    }
    al_unlock_bitmap(in_stack_fffffffffffffbd0);
    al_restore_state((ALLEGRO_STATE *)in_stack_fffffffffffffbd0);
  }
  return;
}

Assistant:

void al_convert_mask_to_alpha(ALLEGRO_BITMAP *bitmap, ALLEGRO_COLOR mask_color)
{
   ALLEGRO_LOCKED_REGION *lr;
   int x, y;
   ALLEGRO_COLOR pixel;
   ALLEGRO_COLOR alpha_pixel;
   ALLEGRO_STATE state;

   if (!(lr = al_lock_bitmap(bitmap, ALLEGRO_PIXEL_FORMAT_ANY, 0))) {
      ALLEGRO_ERROR("Couldn't lock bitmap.");
      return;
   }

   al_store_state(&state, ALLEGRO_STATE_TARGET_BITMAP);
   al_set_target_bitmap(bitmap);

   alpha_pixel = al_map_rgba(0, 0, 0, 0);

   for (y = 0; y < bitmap->h; y++) {
      for (x = 0; x < bitmap->w; x++) {
         pixel = al_get_pixel(bitmap, x, y);
         if (memcmp(&pixel, &mask_color, sizeof(ALLEGRO_COLOR)) == 0) {
            al_put_pixel(x, y, alpha_pixel);
         }
      }
   }

   al_unlock_bitmap(bitmap);

   al_restore_state(&state);
}